

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_fseek(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_io_stream *pjVar1;
  int iVar2;
  io_private *pDev_00;
  char *pcVar3;
  jx9_int64 jVar4;
  int iValue;
  char *local_60;
  int local_44;
  int rc;
  int whence;
  jx9_int64 iOfft;
  io_private *pDev;
  jx9_io_stream *pStream;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((nArg < 2) || (iVar2 = jx9_value_is_resource(*apArg), iVar2 == 0)) {
    jx9_context_throw_error(pCtx,2,"Expecting an IO handle");
    jx9_result_int(pCtx,-1);
    return 0;
  }
  pDev_00 = (io_private *)jx9_value_to_resource(*apArg);
  if ((pDev_00 != (io_private *)0x0) && (pDev_00->iMagic == 0xfeac14)) {
    pjVar1 = pDev_00->pStream;
    if ((pjVar1 != (jx9_io_stream *)0x0) &&
       (pjVar1->xSeek != (_func_int_void_ptr_jx9_int64_int *)0x0)) {
      jVar4 = jx9_value_to_int64(apArg[1]);
      local_44 = 0;
      if ((2 < nArg) && (iVar2 = jx9_value_is_int(apArg[2]), iVar2 != 0)) {
        local_44 = jx9_value_to_int(apArg[2]);
      }
      iVar2 = (*pjVar1->xSeek)(pDev_00->pHandle,jVar4,local_44);
      if (iVar2 == 0) {
        ResetIOPrivate(pDev_00);
      }
      iValue = -1;
      if (iVar2 == 0) {
        iValue = 0;
      }
      jx9_result_int(pCtx,iValue);
      return 0;
    }
    pcVar3 = jx9_function_name(pCtx);
    if (pjVar1 == (jx9_io_stream *)0x0) {
      local_60 = "null_stream";
    }
    else {
      local_60 = pjVar1->zName;
    }
    jx9_context_throw_error_format
              (pCtx,2,"IO routine(%s) not implemented in the underlying stream(%s) device",pcVar3,
               local_60);
    jx9_result_int(pCtx,-1);
    return 0;
  }
  jx9_context_throw_error(pCtx,2,"Expecting an IO handle");
  jx9_result_int(pCtx,-1);
  return 0;
}

Assistant:

static int jx9Builtin_fseek(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	io_private *pDev;
	jx9_int64 iOfft;
	int whence;  
	int rc;
	if( nArg < 2 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  || pStream->xSeek == 0){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	/* Extract the offset */
	iOfft = jx9_value_to_int64(apArg[1]);
	whence = 0;/* SEEK_SET */
	if( nArg > 2 && jx9_value_is_int(apArg[2]) ){
		whence = jx9_value_to_int(apArg[2]);
	}
	/* Perform the requested operation */
	rc = pStream->xSeek(pDev->pHandle, iOfft, whence);
	if( rc == JX9_OK ){
		/* Ignore buffered data */
		ResetIOPrivate(pDev);
	}
	/* IO result */
	jx9_result_int(pCtx, rc == JX9_OK ? 0 : - 1);
	return JX9_OK;	
}